

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_set_option(png_structrp png_ptr,int option,int onoff)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  png_uint_32 current;
  png_uint_32 setting;
  png_uint_32 mask;
  int onoff_local;
  int option_local;
  png_structrp png_ptr_local;
  
  if ((((png_ptr == (png_structrp)0x0) || (option < 0)) || (0xb < option)) || ((option & 1U) != 0))
  {
    png_ptr_local._4_4_ = 1;
  }
  else {
    bVar3 = (byte)option;
    uVar2 = 3 << (bVar3 & 0x1f);
    uVar1 = png_ptr->options;
    png_ptr->options = uVar1 & (uVar2 ^ 0xffffffff) | (onoff != 0) + 2 << (bVar3 & 0x1f);
    png_ptr_local._4_4_ = (int)(uVar1 & uVar2) >> (bVar3 & 0x1f);
  }
  return png_ptr_local._4_4_;
}

Assistant:

int PNGAPI
png_set_option(png_structrp png_ptr, int option, int onoff)
{
   if (png_ptr != NULL && option >= 0 && option < PNG_OPTION_NEXT &&
      (option & 1) == 0)
   {
      png_uint_32 mask = 3U << option;
      png_uint_32 setting = (2U + (onoff != 0)) << option;
      png_uint_32 current = png_ptr->options;

      png_ptr->options = (png_uint_32)((current & ~mask) | setting);

      return (int)(current & mask) >> option;
   }

   return PNG_OPTION_INVALID;
}